

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigDecimal.cpp
# Opt level: O0

void xercesc_4_0::XMLBigDecimal::parseDecimal(XMLCh *toParse,MemoryManager *manager)

{
  bool bVar1;
  NumberFormatException *pNVar2;
  XMLSize_t XVar3;
  XMLCh *pXStack_38;
  bool dotSignFound;
  XMLCh *endPtr;
  XMLCh *local_20;
  XMLCh *startPtr;
  MemoryManager *manager_local;
  XMLCh *toParse_local;
  
  local_20 = toParse;
  while (bVar1 = XMLChar1_0::isWhitespace(*local_20), bVar1) {
    local_20 = local_20 + 1;
  }
  if (*local_20 != L'\0') {
    XVar3 = XMLString::stringLen(toParse);
    pXStack_38 = toParse + XVar3;
    while (bVar1 = XMLChar1_0::isWhitespace(pXStack_38[-1]), bVar1) {
      pXStack_38 = pXStack_38 + -1;
    }
    if (*local_20 == L'-') {
      local_20 = local_20 + 1;
      if (local_20 == pXStack_38) {
        pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (pNVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                   ,0x152,XMLNUM_Inv_chars,manager);
        __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                    NumberFormatException::~NumberFormatException);
      }
    }
    else if ((*local_20 == L'+') && (local_20 = local_20 + 1, local_20 == pXStack_38)) {
      pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (pNVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                 ,0x15a,XMLNUM_Inv_chars,manager);
      __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                  NumberFormatException::~NumberFormatException);
    }
    for (; *local_20 == L'0'; local_20 = local_20 + 1) {
    }
    if (local_20 < pXStack_38) {
      bVar1 = false;
      while (local_20 < pXStack_38) {
        if (*local_20 == L'.') {
          if (bVar1) {
            pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
            NumberFormatException::NumberFormatException
                      (pNVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                       ,0x176,XMLNUM_2ManyDecPoint,manager);
            __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                        NumberFormatException::~NumberFormatException);
          }
          bVar1 = true;
          local_20 = local_20 + 1;
        }
        else {
          if (((ushort)*local_20 < 0x30) || (0x39 < (ushort)*local_20)) {
            pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
            NumberFormatException::NumberFormatException
                      (pNVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
                       ,0x17b,XMLNUM_Inv_chars,manager);
            __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                        NumberFormatException::~NumberFormatException);
          }
          local_20 = local_20 + 1;
        }
      }
    }
    return;
  }
  pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
  NumberFormatException::NumberFormatException
            (pNVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigDecimal.cpp"
             ,0x143,XMLNUM_WSString,manager);
  __cxa_throw(pNVar2,&NumberFormatException::typeinfo,NumberFormatException::~NumberFormatException)
  ;
}

Assistant:

void  XMLBigDecimal::parseDecimal(const XMLCh*         const toParse
                               ,        MemoryManager* const manager)
{

    // Strip leading white space, if any. 
    const XMLCh* startPtr = toParse;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    // If we hit the end, then return failure
    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Strip tailing white space, if any.
    const XMLCh* endPtr = toParse + XMLString::stringLen(toParse);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    // '+' or '-' is allowed only at the first position
    // and is NOT included in the return parsed string

    if (*startPtr == chDash)
    {
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }

    // Strip leading zeros
    while (*startPtr == chDigit_0)
        startPtr++;

    // containning zero, only zero, nothing but zero
    // it is a zero, indeed
    if (startPtr >= endPtr)
    {
        return;
    }

    // Scan data
    bool   dotSignFound = false;
    while (startPtr < endPtr)
    {
        if (*startPtr == chPeriod)
        {
            if (!dotSignFound)
            {
                dotSignFound = true;
                startPtr++;
                continue;
            }
            else  // '.' is allowed only once
                ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_2ManyDecPoint, manager);
        }

        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        startPtr++;

    }

    return;
}